

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O1

boolean decode_mcu_AC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  jpeg_source_mgr *pjVar3;
  bool bVar4;
  boolean bVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint unaff_EBP;
  uint uVar10;
  _func_void_j_decompress_ptr *get_buffer;
  uint nbits;
  int iVar11;
  int bits_left;
  bitread_working_state br_state;
  bitread_working_state local_70;
  d_derived_tbl *local_48;
  JBLOCKROW local_40;
  int *local_38;
  
  pjVar2 = cinfo->entropy;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar2[3].decode_mcu != 0)) ||
     (bVar5 = process_restart(cinfo), bVar5 != 0)) {
    if (*(int *)((long)&pjVar2[3].start_pass + 4) == 0) {
      if (*(int *)&pjVar2[2].start_pass == 0) {
        iVar8 = cinfo->Se;
        iVar1 = cinfo->Al;
        local_38 = cinfo->natural_order;
        local_70.next_input_byte = cinfo->src->next_input_byte;
        local_70.bytes_in_buffer = cinfo->src->bytes_in_buffer;
        get_buffer = pjVar2[1].start_pass;
        bits_left = *(int *)&pjVar2[1].decode_mcu;
        iVar9 = cinfo->Ss;
        if (iVar8 < iVar9) {
          iVar8 = 0;
        }
        else {
          local_40 = *MCU_data;
          local_48 = (d_derived_tbl *)pjVar2[6].start_pass;
          local_70.cinfo = cinfo;
          do {
            if (bits_left < 8) {
              bVar5 = jpeg_fill_bit_buffer(&local_70,(bit_buf_type)get_buffer,bits_left,0);
              if (bVar5 != 0) {
                iVar11 = 1;
                get_buffer = (_func_void_j_decompress_ptr *)local_70.get_buffer;
                bits_left = local_70.bits_left;
                if (7 < local_70.bits_left) goto LAB_00284c3d;
                goto LAB_00284c6f;
              }
LAB_00284c9f:
              bVar4 = false;
            }
            else {
LAB_00284c3d:
              uVar7 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
              if (local_48->look_nbits[uVar7] == 0) {
                iVar11 = 9;
LAB_00284c6f:
                unaff_EBP = jpeg_huff_decode(&local_70,(bit_buf_type)get_buffer,bits_left,local_48,
                                             iVar11);
                if ((int)unaff_EBP < 0) {
                  unaff_EBP = 0xffffffff;
                  goto LAB_00284c9f;
                }
                bVar4 = true;
                get_buffer = (_func_void_j_decompress_ptr *)local_70.get_buffer;
                bits_left = local_70.bits_left;
              }
              else {
                bits_left = bits_left - local_48->look_nbits[uVar7];
                unaff_EBP = (uint)local_48->look_sym[uVar7];
                bVar4 = true;
              }
            }
            if (!bVar4) {
              return 0;
            }
            iVar11 = (int)unaff_EBP >> 4;
            nbits = unaff_EBP & 0xf;
            if (nbits == 0) {
              if (iVar11 != 0xf) {
                iVar8 = 1 << ((byte)iVar11 & 0x1f);
                if (0xf < unaff_EBP) {
                  if ((bits_left < iVar11) &&
                     (bVar5 = jpeg_fill_bit_buffer
                                        (&local_70,(bit_buf_type)get_buffer,bits_left,iVar11),
                     get_buffer = (_func_void_j_decompress_ptr *)local_70.get_buffer,
                     bits_left = local_70.bits_left, bVar5 == 0)) {
                    return 0;
                  }
                  bits_left = bits_left - iVar11;
                  iVar8 = ((uint)((long)get_buffer >> ((byte)bits_left & 0x3f)) & bmask[iVar11]) +
                          iVar8;
                }
                iVar8 = iVar8 + -1;
                goto LAB_00284dc2;
              }
              iVar11 = iVar9 + 0xf;
              unaff_EBP = 0;
            }
            else {
              if ((bits_left < (int)nbits) &&
                 (bVar5 = jpeg_fill_bit_buffer(&local_70,(bit_buf_type)get_buffer,bits_left,nbits),
                 get_buffer = (_func_void_j_decompress_ptr *)local_70.get_buffer,
                 bits_left = local_70.bits_left, bVar5 == 0)) {
                return 0;
              }
              bits_left = bits_left - nbits;
              iVar11 = iVar11 + iVar9;
              uVar6 = bmask[nbits];
              uVar10 = (uint)((long)get_buffer >> ((byte)bits_left & 0x3f)) & uVar6;
              if (bmask[nbits - 1] < (int)uVar10) {
                uVar6 = 0;
              }
              unaff_EBP = uVar10 - uVar6;
              (*local_40)[local_38[iVar11]] = (JCOEF)(unaff_EBP << ((byte)iVar1 & 0x1f));
            }
            iVar9 = iVar11 + 1;
          } while (iVar11 < iVar8);
          iVar8 = 0;
        }
LAB_00284dc2:
        pjVar3 = cinfo->src;
        pjVar3->next_input_byte = local_70.next_input_byte;
        pjVar3->bytes_in_buffer = local_70.bytes_in_buffer;
        pjVar2[1].start_pass = get_buffer;
        *(int *)&pjVar2[1].decode_mcu = bits_left;
      }
      else {
        iVar8 = *(int *)&pjVar2[2].start_pass + -1;
      }
      *(int *)&pjVar2[2].start_pass = iVar8;
    }
    *(int *)&pjVar2[3].decode_mcu = *(int *)&pjVar2[3].decode_mcu + -1;
    bVar5 = 1;
  }
  else {
    bVar5 = 0;
  }
  return bVar5;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_first (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, sign, k;
  int v, m;
  const int * natural_order;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  natural_order = cinfo->natural_order;

  /* There is always only one block per MCU */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Sections F.2.4.2 & F.1.4.4.2: Decoding of AC coefficients */

  /* Figure F.20: Decode_AC_coefficients */
  for (k = cinfo->Ss; k <= cinfo->Se; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (arith_decode(cinfo, st)) break;		/* EOB flag */
    while (arith_decode(cinfo, st + 1) == 0) {
      st += 3; k++;
      if (k > cinfo->Se) {
	WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	entropy->ct = -1;			/* spectral overflow */
	return TRUE;
      }
    }
    /* Figure F.21: Decoding nonzero value v */
    /* Figure F.22: Decoding the sign of v */
    sign = arith_decode(cinfo, entropy->fixed_bin);
    st += 2;
    /* Figure F.23: Decoding the magnitude category of v */
    if ((m = arith_decode(cinfo, st)) != 0) {
      if (arith_decode(cinfo, st)) {
	m <<= 1;
	st = entropy->ac_stats[tbl] +
	     (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
	while (arith_decode(cinfo, st)) {
	  if ((m <<= 1) == 0x8000) {
	    WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	    entropy->ct = -1;			/* magnitude overflow */
	    return TRUE;
	  }
	  st += 1;
	}
      }
    }
    v = m;
    /* Figure F.24: Decoding the magnitude bit pattern of v */
    st += 14;
    while (m >>= 1)
      if (arith_decode(cinfo, st)) v |= m;
    v += 1; if (sign) v = -v;
    /* Scale and output coefficient in natural (dezigzagged) order */
    (*block)[natural_order[k]] = (JCOEF) (v << cinfo->Al);
  }

  return TRUE;
}